

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O0

char * str_replace(char **s,size_t pos,size_t len,char *replacement)

{
  size_t sVar1;
  char *__n;
  char *pcVar2;
  size_t replacementlen;
  size_t totallen;
  char *replacement_local;
  size_t len_local;
  size_t pos_local;
  char **s_local;
  
  if ((s == (char **)0x0) || (*s == (char *)0x0)) {
    s_local = (char **)0x0;
  }
  else {
    sVar1 = strlen(*s);
    __n = (char *)strlen(replacement);
    len_local = pos;
    if (sVar1 < pos) {
      len_local = sVar1;
    }
    replacement_local = (char *)len;
    if (sVar1 < len_local + len) {
      replacement_local = (char *)(sVar1 - len_local);
    }
    if (replacement_local < __n) {
      pcVar2 = (char *)realloc(*s,(size_t)(__n + (sVar1 - (long)replacement_local) + 1));
      *s = pcVar2;
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    memmove(*s + len_local + (long)__n,*s + len_local + (long)replacement_local,
            ((sVar1 - len_local) - (long)replacement_local) + 1);
    memcpy(*s + len_local,replacement,(size_t)__n);
    s_local = (char **)*s;
  }
  return (char *)s_local;
}

Assistant:

char* str_replace (char** s, size_t pos, size_t len, char* replacement)
{
  if (!s || !*s)
    return NULL;
  size_t totallen = strlen(*s);
  size_t replacementlen = strlen(replacement);
  if (pos > totallen)
    pos = totallen;
  if (pos + len > totallen)
    len = totallen - pos;
  if (replacementlen > len) {
    if ((*s = (char*)realloc(*s, totallen - len + replacementlen + 1)) == NULL) {
      //memory allocation error
      return NULL;
    }
  }
  memmove(*s + pos + replacementlen, *s + pos + len, totallen - pos - len + 1);
  memcpy(*s + pos, replacement, replacementlen);
  return *s;
}